

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

void __thiscall Chainstate::UpdateTip(Chainstate *this,CBlockIndex *pindexNew)

{
  long lVar1;
  Notifications *pNVar2;
  string original;
  bool bVar3;
  ThresholdState TVar4;
  CCoinsViewCache *coins_tip;
  Chainstate *pCVar5;
  reference cache;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffea8;
  CChainParams *params;
  CCoinsViewCache *in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  vector<bilingual_str,_std::allocator<bilingual_str>_> warning_messages;
  allocator<char> local_119;
  string local_118 [32];
  string local_f8;
  bilingual_str local_d8;
  bilingual_str warning;
  WarningBitsConditionChecker checker;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  coins_tip = CoinsTip(this);
  params = (this->m_chainman->m_options).chainparams;
  pCVar5 = ChainstateManager::ActiveChainstate(this->m_chainman);
  if (pCVar5 == this) {
    if (this->m_mempool != (CTxMemPool *)0x0) {
      CTxMemPool::AddTransactionsUpdated(this->m_mempool,1);
    }
    warning_messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    warning_messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    warning_messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar3 = ChainstateManager::IsInitialBlockDownload(this->m_chainman);
    if (!bVar3) {
      for (local_f8._M_dataplus._M_p._0_4_ = 0; in_stack_fffffffffffffeb8 = coins_tip,
          (int)local_f8._M_dataplus._M_p < 0x1d;
          local_f8._M_dataplus._M_p._0_4_ = (int)local_f8._M_dataplus._M_p + 1) {
        checker.m_chainman = this->m_chainman;
        checker.super_AbstractThresholdConditionChecker._vptr_AbstractThresholdConditionChecker =
             (_func_int **)&PTR_Condition_011454d8;
        checker.m_bit = (int)local_f8._M_dataplus._M_p;
        cache = std::
                array<std::map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>,_29UL>
                ::at(&(checker.m_chainman)->m_warningcache,(long)(int)local_f8._M_dataplus._M_p);
        TVar4 = AbstractThresholdConditionChecker::GetStateFor
                          (&checker.super_AbstractThresholdConditionChecker,pindexNew,
                           &params->consensus,cache);
        if ((TVar4 & ~STARTED) == LOCKED_IN) {
          _(&local_d8,(ConstevalStringLiteral)0xcd1a88);
          tinyformat::format<int>(&warning,&local_d8,(int *)&local_f8);
          bilingual_str::~bilingual_str(&local_d8);
          if (TVar4 == ACTIVE) {
            pNVar2 = (this->m_chainman->m_options).notifications;
            (*pNVar2->_vptr_Notifications[5])(pNVar2,0,&warning);
          }
          else {
            std::vector<bilingual_str,_std::allocator<bilingual_str>_>::push_back
                      (&warning_messages,&warning);
          }
          bilingual_str::~bilingual_str(&warning);
        }
      }
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&checker,"UpdateTip",&local_119);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"",(allocator<char> *)&stack0xfffffffffffffec7);
    std::__cxx11::string::string<std::allocator<char>>
              (local_118,", ",(allocator<char> *)&stack0xfffffffffffffec6);
    original._M_string_length = (size_type)params;
    original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffea8;
    original.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffeb8;
    original.field_2._8_8_ = in_stack_fffffffffffffec0;
    Untranslated(&local_d8,original);
    util::
    Join<std::vector<bilingual_str,std::allocator<bilingual_str>>,bilingual_str,util::Join<std::vector<bilingual_str,std::allocator<bilingual_str>>,bilingual_str>(std::vector<bilingual_str,std::allocator<bilingual_str>>const&,bilingual_str_const&)::_lambda(auto:1_const&)_1_>
              (&warning,(util *)&warning_messages,&local_d8);
    UpdateTipLog(coins_tip,pindexNew,params,(string *)&checker,&local_f8,&warning.original);
    bilingual_str::~bilingual_str(&warning);
    bilingual_str::~bilingual_str(&local_d8);
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&checker);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector(&warning_messages);
  }
  else if (pindexNew->nHeight % 2000 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&warning,"UpdateTip",(allocator<char> *)&local_f8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"[background validation] ",(allocator<char> *)&warning_messages);
    std::__cxx11::string::string<std::allocator<char>>((string *)&checker,"",&local_119);
    UpdateTipLog(coins_tip,pindexNew,params,&warning.original,&local_d8.original,(string *)&checker)
    ;
    std::__cxx11::string::~string((string *)&checker);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&warning);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Chainstate::UpdateTip(const CBlockIndex* pindexNew)
{
    AssertLockHeld(::cs_main);
    const auto& coins_tip = this->CoinsTip();

    const CChainParams& params{m_chainman.GetParams()};

    // The remainder of the function isn't relevant if we are not acting on
    // the active chainstate, so return if need be.
    if (this != &m_chainman.ActiveChainstate()) {
        // Only log every so often so that we don't bury log messages at the tip.
        constexpr int BACKGROUND_LOG_INTERVAL = 2000;
        if (pindexNew->nHeight % BACKGROUND_LOG_INTERVAL == 0) {
            UpdateTipLog(coins_tip, pindexNew, params, __func__, "[background validation] ", "");
        }
        return;
    }

    // New best block
    if (m_mempool) {
        m_mempool->AddTransactionsUpdated(1);
    }

    std::vector<bilingual_str> warning_messages;
    if (!m_chainman.IsInitialBlockDownload()) {
        const CBlockIndex* pindex = pindexNew;
        for (int bit = 0; bit < VERSIONBITS_NUM_BITS; bit++) {
            WarningBitsConditionChecker checker(m_chainman, bit);
            ThresholdState state = checker.GetStateFor(pindex, params.GetConsensus(), m_chainman.m_warningcache.at(bit));
            if (state == ThresholdState::ACTIVE || state == ThresholdState::LOCKED_IN) {
                const bilingual_str warning = strprintf(_("Unknown new rules activated (versionbit %i)"), bit);
                if (state == ThresholdState::ACTIVE) {
                    m_chainman.GetNotifications().warningSet(kernel::Warning::UNKNOWN_NEW_RULES_ACTIVATED, warning);
                } else {
                    warning_messages.push_back(warning);
                }
            }
        }
    }
    UpdateTipLog(coins_tip, pindexNew, params, __func__, "",
                 util::Join(warning_messages, Untranslated(", ")).original);
}